

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall
FxCompareEq::EmitCommon(FxCompareEq *this,VMFunctionBuilder *build,bool forcompare,bool invert)

{
  FxExpression *pFVar1;
  ExpEmit EVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar5;
  uint local_74;
  int local_5c;
  int local_58;
  uint local_50;
  uint local_3c;
  int local_38;
  int a;
  int instr;
  ExpEmit op2;
  ExpEmit op1;
  bool invert_local;
  bool forcompare_local;
  VMFunctionBuilder *build_local;
  FxCompareEq *this_local;
  ExpEmit to;
  ulong uVar4;
  
  pFVar1 = (this->super_FxBinary).left;
  op2._0_4_ = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  op2.Konst = (bool)(char)extraout_var;
  op2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  op2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  op2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  pFVar1 = (this->super_FxBinary).right;
  iVar3 = (*pFVar1->_vptr_FxExpression[9])(pFVar1,build);
  uVar4 = CONCAT44(extraout_var_00,iVar3);
  instr._0_1_ = (uint8_t)((uint)iVar3 >> 0x10);
  unique0x10000420 = uVar4;
  if (op2.RegType != (uint8_t)instr) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xdcd,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
  }
  if (op2.RegType == '\x02') {
    ExpEmit::ExpEmit((ExpEmit *)&this_local,build,0,1);
    bVar5 = true;
    if (((this->super_FxBinary).Operator != 0x11f) &&
       (bVar5 = true, (this->super_FxBinary).Operator != 0x120)) {
      bVar5 = (this->super_FxBinary).Operator == 0x121;
    }
    if (!bVar5) {
      __assert_fail("Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdd3,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    if ((this->super_FxBinary).Operator == 0x11f) {
      local_50 = 0;
    }
    else {
      local_50 = 0x20;
      if ((this->super_FxBinary).Operator == 0x120) {
        local_50 = 1;
      }
    }
    local_3c = local_50;
    if (((ulong)op2 & 0x100000000) != 0) {
      local_3c = local_50 | 8;
    }
    if ((stack0xffffffffffffffce & 0x100000000) != 0) {
      local_3c = local_3c | 0x10;
    }
    if (invert) {
      local_3c = local_3c ^ 1;
    }
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,1,(uint)(ushort)this_local,0,0);
    }
    VMFunctionBuilder::Emit(build,0x59,local_3c,(uint)op2.RegNum,(uint)a._2_2_);
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,(uint)(ushort)this_local,1);
    }
    ExpEmit::Free(&op2,build);
    ExpEmit::Free((ExpEmit *)((long)&a + 2),build);
  }
  else {
    if (((ulong)op2 & 0x100000000) != 0) {
      swapvalues<ExpEmit>(&op2,(ExpEmit *)((long)&a + 2));
    }
    if (((op2.Konst ^ 0xffU) & 1) == 0) {
      __assert_fail("!op1.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdee,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    if (op2.RegCount == '\0' || 3 < op2.RegCount) {
      __assert_fail("op1.RegCount >= 1 && op1.RegCount <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xdef,"ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *, bool, bool)");
    }
    ExpEmit::ExpEmit((ExpEmit *)&this_local,build,0,1);
    if (op2.RegType == '\0') {
      local_58 = 0x89;
    }
    else {
      if (op2.RegType == '\x01') {
        local_5c = EmitCommon::flops[(int)(op2.RegCount - 1)];
      }
      else {
        local_5c = 0xcf;
      }
      local_58 = local_5c;
    }
    local_38 = local_58;
    ExpEmit::Free(&op2,build);
    if ((stack0xffffffffffffffce & 0x100000000) == 0) {
      ExpEmit::Free((ExpEmit *)((long)&a + 2),build);
    }
    else {
      local_38 = local_58 + 1;
    }
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,1,(uint)(ushort)this_local,0,0);
    }
    if ((this->super_FxBinary).Operator == 0x121) {
      local_74 = 0x20;
    }
    else {
      local_74 = (uint)((this->super_FxBinary).Operator != 0x11f);
    }
    VMFunctionBuilder::Emit(build,local_38,invert ^ local_74,(uint)op2.RegNum,(uint)a._2_2_);
    if (!forcompare) {
      VMFunctionBuilder::Emit(build,0x44,1);
      VMFunctionBuilder::Emit(build,1,(uint)(ushort)this_local,1);
    }
  }
  EVar2.RegType = this_local._2_1_;
  EVar2.RegCount = this_local._3_1_;
  EVar2.Konst = (bool)this_local._4_1_;
  EVar2.Fixed = (bool)this_local._5_1_;
  EVar2.Final = (bool)this_local._6_1_;
  EVar2.Target = (bool)this_local._7_1_;
  EVar2.RegNum = (ushort)this_local;
  return EVar2;
}

Assistant:

ExpEmit FxCompareEq::EmitCommon(VMFunctionBuilder *build, bool forcompare, bool invert)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	int instr;

	if (op1.RegType == REGT_STRING)
	{
		ExpEmit to(build, REGT_INT);
		assert(Operator == TK_Eq || Operator == TK_Neq || Operator == TK_ApproxEq);
		int a = Operator == TK_Eq ? CMP_EQ :
			Operator == TK_Neq ? CMP_EQ | CMP_CHECK : CMP_EQ | CMP_APPROX;

		if (op1.Konst) a |= CMP_BK;
		if (op2.Konst) a |= CMP_CK;
		if (invert) a ^= CMP_CHECK;

		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(OP_CMPS, a, op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		op1.Free(build);
		op2.Free(build);
		return to;
	}
	else
	{

		// Only the second operand may be constant.
		if (op1.Konst)
		{
			swapvalues(op1, op2);
		}
		assert(!op1.Konst);
		assert(op1.RegCount >= 1 && op1.RegCount <= 3);

		ExpEmit to(build, REGT_INT);

		static int flops[] = { OP_EQF_R, OP_EQV2_R, OP_EQV3_R };
		instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? flops[op1.RegCount - 1] :
			OP_EQA_R;
		op1.Free(build);
		if (!op2.Konst)
		{
			op2.Free(build);
		}
		else
		{
			instr += 1;
		}

		// See FxUnaryNotBoolean for comments, since it's the same thing.
		if (!forcompare) build->Emit(OP_LI, to.RegNum, 0, 0);
		build->Emit(instr, int(invert) ^ (Operator == TK_ApproxEq ? CMP_APPROX : ((Operator != TK_Eq) ? CMP_CHECK : 0)), op1.RegNum, op2.RegNum);
		if (!forcompare)
		{
			build->Emit(OP_JMP, 1);
			build->Emit(OP_LI, to.RegNum, 1);
		}
		return to;
	}
}